

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O0

bool __thiscall ON_PlaneSurface::Reverse(ON_PlaneSurface *this,int dir)

{
  ON_3dVector local_68;
  ON_3dVector local_50;
  ON_3dVector local_38;
  int local_1c;
  ON_PlaneSurface *pOStack_18;
  int dir_local;
  ON_PlaneSurface *this_local;
  
  if ((dir < 0) || (1 < dir)) {
    this_local._7_1_ = false;
  }
  else {
    local_1c = dir;
    pOStack_18 = this;
    ON_Interval::Reverse((ON_Interval *)(&this->field_0xb0 + (long)dir * 0x10));
    ON_Interval::Reverse((ON_Interval *)(&this->field_0x90 + (long)local_1c * 0x10));
    if (local_1c == 0) {
      ON_3dVector::operator-(&local_50,&(this->m_plane).xaxis);
      (this->m_plane).xaxis.x = local_50.x;
      (this->m_plane).xaxis.y = local_50.y;
      (this->m_plane).xaxis.z = local_50.z;
    }
    else {
      ON_3dVector::operator-(&local_38,&(this->m_plane).yaxis);
      (this->m_plane).yaxis.x = local_38.x;
      (this->m_plane).yaxis.y = local_38.y;
      (this->m_plane).yaxis.z = local_38.z;
    }
    ON_3dVector::operator-(&local_68,&(this->m_plane).zaxis);
    (this->m_plane).zaxis.x = local_68.x;
    (this->m_plane).zaxis.y = local_68.y;
    (this->m_plane).zaxis.z = local_68.z;
    ON_Plane::UpdateEquation(&this->m_plane);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
ON_PlaneSurface::Reverse( int dir )
{
  if ( dir < 0 || dir > 1 )
    return false;
  m_extents[dir].Reverse();
  m_domain[dir].Reverse();
  if (dir)
    m_plane.yaxis = -m_plane.yaxis;
  else
    m_plane.xaxis = -m_plane.xaxis;
  m_plane.zaxis = -m_plane.zaxis;
  m_plane.UpdateEquation();
  return true;
}